

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

Bit32u __thiscall MT32Emu::Synth::addMIDIInterfaceDelay(Synth *this,Bit32u len,Bit32u timestamp)

{
  Bit32u local_18;
  Bit32u transferTime;
  Bit32u timestamp_local;
  Bit32u len_local;
  Synth *this_local;
  
  local_18 = timestamp;
  if ((int)(timestamp - this->lastReceivedMIDIEventTimestamp) < 0) {
    local_18 = this->lastReceivedMIDIEventTimestamp;
  }
  local_18 = (int)(long)((double)len * 8.192) + local_18;
  this->lastReceivedMIDIEventTimestamp = local_18;
  return local_18;
}

Assistant:

Bit32u Synth::addMIDIInterfaceDelay(Bit32u len, Bit32u timestamp) {
	Bit32u transferTime =  Bit32u(double(len) * MIDI_DATA_TRANSFER_RATE);
	// Dealing with wrapping
	if (Bit32s(timestamp - lastReceivedMIDIEventTimestamp) < 0) {
		timestamp = lastReceivedMIDIEventTimestamp;
	}
	timestamp += transferTime;
	lastReceivedMIDIEventTimestamp = timestamp;
	return timestamp;
}